

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_SimdStArrGeneric<Js::OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  byte bVar1;
  byte bVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined4 *puVar7;
  long lVar8;
  ArrayBufferBase *pAVar9;
  undefined4 extraout_var;
  ScriptContext *scriptContext;
  uint8 in_R8B;
  long lVar10;
  SIMDValue simdValue;
  
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x205e,"(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT)",
                                "playout->ViewType < Js::ArrayBufferView::TYPE_COUNT");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  lVar8 = (long)*(int *)(*(long *)(this + 0x118) + (ulong)playout->SlotIndex * 4);
  if (lVar8 < 0) {
    scriptContext = *(ScriptContext **)(this + 0x78);
  }
  else {
    lVar8 = (ulong)playout->Offset + lVar8;
    if ((*(byte *)(*(long *)(this + 0x88) + 0x46) & 8) == 0) {
      pAVar9 = (ArrayBufferBase *)GetAsmJsBuffer(this);
    }
    else {
      pAVar9 = WebAssemblyMemory::GetBuffer(*(WebAssemblyMemory **)(this + 0x138));
    }
    iVar5 = (*(((ArrayBuffer *)&pAVar9->super_DynamicObject)->super_ArrayBufferBase).
              super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])(pAVar9);
    bVar1 = playout->DataWidth;
    bVar2 = playout->Value;
    uVar6 = (*(((ArrayBuffer *)&pAVar9->super_DynamicObject)->super_ArrayBufferBase).
              super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(pAVar9);
    if ((ulong)bVar1 + lVar8 <= (ulong)uVar6) {
      lVar10 = (ulong)bVar2 * 0x10;
      simdValue.field_0.u8[8] = bVar1;
      simdValue.field_0.f64[0] = (Type)*(undefined8 *)(*(long *)(this + 0x148) + 8 + lVar10);
      simdValue.field_0.i64[1]._1_7_ = 0;
      SIMDUtils::SIMDStData
                ((SIMDUtils *)(CONCAT44(extraout_var,iVar5) + lVar8),
                 *(SIMDValue **)(*(long *)(this + 0x148) + lVar10),simdValue,in_R8B);
      return;
    }
    scriptContext = *(ScriptContext **)(this + 0x78);
  }
  JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ebf6,L"Simd typed array access");
}

Assistant:

void InterpreterStackFrame::OP_SimdStArrGeneric(const unaligned T* playout)
    {
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);

        if (GetRegRawInt(playout->SlotIndex) < 0)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("Simd typed array access"));
        }
        const uint64 index = (uint64)GetRegRawInt(playout->SlotIndex) + playout->Offset;

        ArrayBufferBase* arr =
#ifdef ENABLE_WASM_SIMD
        (m_functionBody->IsWasmFunction()) ?
            m_wasmMemory->GetBuffer() :
#endif
            GetAsmJsBuffer();

        BYTE* buffer = arr->GetBuffer();
        uint8 dataWidth = playout->DataWidth;
        RegSlot srcReg = playout->Value;

        if (index + dataWidth > arr->GetByteLength())
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("Simd typed array access"));
        }
        AsmJsSIMDValue *data = (AsmJsSIMDValue*)(buffer + index);
        AsmJsSIMDValue value = GetRegRawSimd(srcReg);
        SIMDUtils::SIMDStData(data, value, dataWidth);
    }